

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O0

void __thiscall Assimp::XFileExporter::WriteNode(XFileExporter *this,aiNode *pNode)

{
  aiNode *this_00;
  ostream *poVar1;
  ulong local_240;
  size_t i_1;
  size_t i;
  aiMatrix4x4 m;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  aiNode *local_18;
  aiNode *pNode_local;
  XFileExporter *this_local;
  
  local_18 = pNode;
  pNode_local = (aiNode *)this;
  if ((pNode->mName).length == 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::operator<<(local_190,"Node_");
    std::ostream::operator<<(poVar1,local_18);
    this_00 = local_18;
    std::__cxx11::stringstream::str();
    aiString::Set(&this_00->mName,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  poVar1 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"Frame ");
  toXFileString_abi_cxx11_((string *)&m.d3,this,&local_18->mName);
  poVar1 = std::operator<<(poVar1,(string *)&m.d3);
  poVar1 = std::operator<<(poVar1," {");
  std::operator<<(poVar1,(string *)&this->endstr);
  std::__cxx11::string::~string((string *)&m.d3);
  PushTag(this);
  memcpy(&i,&local_18->mTransformation,0x40);
  WriteFrameTransform(this,(aiMatrix4x4 *)&i);
  for (i_1 = 0; i_1 < local_18->mNumMeshes; i_1 = i_1 + 1) {
    WriteMesh(this,this->mScene->mMeshes[local_18->mMeshes[i_1]]);
  }
  for (local_240 = 0; local_240 < local_18->mNumChildren; local_240 = local_240 + 1) {
    WriteNode(this,local_18->mChildren[local_240]);
  }
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"}");
  poVar1 = std::operator<<(poVar1,(string *)&this->endstr);
  std::operator<<(poVar1,(string *)&this->endstr);
  return;
}

Assistant:

void XFileExporter::WriteNode( aiNode* pNode)
{
    if (pNode->mName.length==0)
    {
        std::stringstream ss;
        ss << "Node_" << pNode;
        pNode->mName.Set(ss.str());
    }
    mOutput << startstr << "Frame " << toXFileString(pNode->mName) << " {" << endstr;

    PushTag();

    aiMatrix4x4 m = pNode->mTransformation;

    WriteFrameTransform(m);

    for (size_t i = 0; i < pNode->mNumMeshes; ++i)
        WriteMesh(mScene->mMeshes[pNode->mMeshes[i]]);

    // recursive call the Nodes
    for (size_t i = 0; i < pNode->mNumChildren; ++i)
        WriteNode(pNode->mChildren[i]);

    PopTag();

    mOutput << startstr << "}" << endstr << endstr;
}